

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O2

void Ssc_ManCnfAddToFrontier(Ssc_Man_t *p,int Id,Vec_Int_t *vFront)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  
  if (Id < 1) {
    __assert_fail("Id > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                  ,199,"void Ssc_ManCnfAddToFrontier(Ssc_Man_t *, int, Vec_Int_t *)");
  }
  iVar1 = Ssc_ObjSatVar(p,Id);
  if (iVar1 == 0) {
    pGVar2 = Gia_ManObj(p->pFraig,Id);
    iVar1 = p->nSatVars;
    p->nSatVars = iVar1 + 1;
    Ssc_ObjSetSatVar(p,Id,iVar1);
    sat_solver_setnvars(p->pSat,p->nSatVars + 100);
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      Vec_IntPush(vFront,Id);
      return;
    }
  }
  return;
}

Assistant:

static void Ssc_ManCnfAddToFrontier( Ssc_Man_t * p, int Id, Vec_Int_t * vFront )
{
    Gia_Obj_t * pObj;
    assert( Id > 0 );
    if ( Ssc_ObjSatVar(p, Id) )
        return;
    pObj = Gia_ManObj( p->pFraig, Id );
    Ssc_ObjSetSatVar( p, Id, p->nSatVars++ );
    sat_solver_setnvars( p->pSat, p->nSatVars + 100 );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_IntPush( vFront, Id );
}